

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaDebug.cpp
# Opt level: O3

HighsDebugStatus __thiscall
HSimplexNla::debugCheckInvert(HSimplexNla *this,string *message,HighsInt alt_debug_level)

{
  bool bVar1;
  int iVar2;
  uint size_;
  int iVar3;
  uint uVar4;
  int iVar5;
  HighsLp *pHVar6;
  pointer piVar7;
  pointer pdVar8;
  pointer piVar9;
  HighsDebugStatus HVar10;
  long lVar11;
  HighsInt lc_iRow;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  HighsInt *pHVar17;
  ulong uVar18;
  HighsOptions *pHVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  HVector rhs;
  HVector column;
  HVector residual;
  string value_adjective;
  HVector residual_1;
  double local_398;
  double local_388;
  double local_378;
  HVectorBase<double> local_368;
  HighsInt *local_2b8;
  ulong local_2b0;
  double local_2a8;
  HVectorBase<double> local_2a0;
  HVector local_1f0;
  string local_140;
  string local_120;
  undefined1 *local_100;
  undefined8 local_f8;
  undefined1 local_f0 [16];
  HVectorBase<double> local_e0;
  
  iVar15 = alt_debug_level;
  if (alt_debug_level < 0) {
    iVar15 = (this->options_->super_HighsOptionsStruct).highs_debug_level;
  }
  HVar10 = kNotChecked;
  if (1 < iVar15) {
    pHVar19 = this->options_;
    iVar2 = (pHVar19->super_HighsOptionsStruct).highs_debug_level;
    if (iVar2 < alt_debug_level) {
      highsLogDev(&(pHVar19->super_HighsOptionsStruct).log_options,kInfo,
                  "CheckNlaINVERT:   Forcing debug\n");
      pHVar19 = this->options_;
    }
    pHVar6 = this->lp_;
    pHVar17 = this->basic_index_;
    uVar12 = pHVar6->num_col_;
    uVar14 = (ulong)uVar12;
    size_ = pHVar6->num_row_;
    uVar18 = (ulong)size_;
    highsLogDev(&(pHVar19->super_HighsOptionsStruct).log_options,kInfo,"\nCheckINVERT: %s\n",
                (message->_M_dataplus)._M_p);
    local_2a0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2a0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_2a0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2a0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2a0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_2a0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_2a0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_2a0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_2a0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2a0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2a0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2a0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_368.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_368.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_368.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_368.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_368.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_368.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_368.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_368.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_368.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_368.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_368.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_368.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_368.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_368.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_368.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    HVectorBase<double>::setup(&local_2a0,size_);
    HVectorBase<double>::setup(&local_368,size_);
    local_1f0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1f0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1f0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1f0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1f0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1f0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1f0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_1f0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1f0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1f0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1f0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1f0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar3 = (pHVar19->super_HighsOptionsStruct).log_dev_level;
    HVectorBase<double>::clear(&local_2a0);
    HVectorBase<double>::clear(&local_368);
    local_2a0.count = -1;
    bVar1 = 1 < iVar3 && (int)size_ < 0x14;
    if (bVar1) {
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,"Basis:");
    }
    if (0 < (int)size_) {
      uVar20 = 0x1fb8610bdae196be;
      uVar13 = 0;
      local_2b8 = pHVar17;
      local_2b0 = uVar14;
      do {
        lVar11 = (long)local_368.count;
        local_368.count = local_368.count + 1;
        local_368.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar11] = (int)uVar13;
        uVar20 = uVar20 >> 0xc ^ uVar20;
        uVar20 = uVar20 << 0x19 ^ uVar20;
        uVar20 = uVar20 >> 0x1b ^ uVar20;
        dVar22 = (double)((((uVar20 >> 0x20) + 0x8a183895eeac1536) *
                           ((uVar20 & 0xffffffff) + 0x42d8680e260ae5b) >> 0x26 ^
                          ((uVar20 >> 0x20) + 0x80c8963be3e4c2f3) *
                          ((uVar20 & 0xffffffff) + 0xc8497d2a400d9551) >> 0xc) + 1) *
                 2.2204460492503126e-16;
        local_2a0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar13] = dVar22;
        uVar4 = pHVar17[uVar13];
        if (bVar1) {
          highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo," %1d",
                      (ulong)uVar4);
          uVar14 = local_2b0;
          pHVar17 = local_2b8;
        }
        uVar12 = (uint)uVar14;
        if ((int)uVar4 < (int)uVar12) {
          piVar7 = (pHVar6->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = piVar7[(int)uVar4];
          lVar11 = (long)iVar3;
          iVar5 = piVar7[(long)(int)uVar4 + 1];
          if (iVar3 < iVar5) {
            piVar7 = (pHVar6->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar8 = (pHVar6->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            do {
              iVar3 = piVar7[lVar11];
              local_368.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3] =
                   pdVar8[lVar11] * dVar22 +
                   local_368.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar3];
              lVar11 = lVar11 + 1;
            } while (iVar5 != lVar11);
          }
        }
        else {
          local_368.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[(int)(uVar4 - uVar12)] =
               dVar22 + local_368.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[(int)(uVar4 - uVar12)];
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar18);
    }
    if (bVar1) {
      highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kInfo,"\n");
    }
    local_1f0.count = local_368.count;
    local_1f0.size = local_368.size;
    std::vector<int,_std::allocator<int>_>::operator=(&local_1f0.index,&local_368.index);
    std::vector<double,_std::allocator<double>_>::operator=(&local_1f0.array,&local_368.array);
    local_1f0.synthetic_tick = local_368.synthetic_tick;
    std::vector<char,_std::allocator<char>_>::operator=(&local_1f0.cwork,&local_368.cwork);
    std::vector<int,_std::allocator<int>_>::operator=(&local_1f0.iwork,&local_368.iwork);
    local_1f0.next = local_368.next;
    local_1f0.packFlag = local_368.packFlag;
    local_1f0._121_3_ = local_368._121_3_;
    local_1f0.packCount = local_368.packCount;
    std::vector<int,_std::allocator<int>_>::operator=(&local_1f0.packIndex,&local_368.packIndex);
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_1f0.packValue,&local_368.packValue);
    ftran(this,&local_368,1.0,(HighsTimerClock *)0x0);
    debugReportInvertSolutionError
              (this,false,&local_2a0,&local_368,&local_1f0,iVar2 < alt_debug_level);
    HVectorBase<double>::clear(&local_368);
    if (0 < (int)size_) {
      uVar14 = 0;
      do {
        lVar11 = (long)local_368.count;
        local_368.count = local_368.count + 1;
        local_368.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar11] = (int)uVar14;
        iVar3 = pHVar17[uVar14];
        if (iVar3 < (int)uVar12) {
          piVar7 = (pHVar6->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar5 = piVar7[iVar3];
          lVar11 = (long)iVar5;
          iVar3 = piVar7[(long)iVar3 + 1];
          if (iVar5 < iVar3) {
            piVar7 = (pHVar6->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar8 = (pHVar6->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            dVar22 = local_368.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar14];
            do {
              dVar22 = dVar22 + local_2a0.array.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[piVar7[lVar11]] *
                                pdVar8[lVar11];
              local_368.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14] = dVar22;
              lVar11 = lVar11 + 1;
            } while (iVar3 != lVar11);
          }
        }
        else {
          local_368.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar14] =
               local_2a0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(int)(iVar3 - uVar12)] +
               local_368.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14];
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar18);
    }
    local_1f0.count = local_368.count;
    local_1f0.size = local_368.size;
    std::vector<int,_std::allocator<int>_>::operator=(&local_1f0.index,&local_368.index);
    std::vector<double,_std::allocator<double>_>::operator=(&local_1f0.array,&local_368.array);
    local_1f0.synthetic_tick = local_368.synthetic_tick;
    std::vector<char,_std::allocator<char>_>::operator=(&local_1f0.cwork,&local_368.cwork);
    std::vector<int,_std::allocator<int>_>::operator=(&local_1f0.iwork,&local_368.iwork);
    local_1f0.next = local_368.next;
    local_1f0.packFlag = local_368.packFlag;
    local_1f0._121_3_ = local_368._121_3_;
    local_1f0.packCount = local_368.packCount;
    std::vector<int,_std::allocator<int>_>::operator=(&local_1f0.packIndex,&local_368.packIndex);
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_1f0.packValue,&local_368.packValue);
    btran(this,&local_368,1.0,(HighsTimerClock *)0x0);
    HVar10 = debugReportInvertSolutionError
                       (this,true,&local_2a0,&local_368,&local_1f0,iVar2 < alt_debug_level);
    if (iVar15 != 2) {
      local_100 = local_f0;
      local_f8 = 0;
      local_f0[0] = 0;
      if ((int)size_ < 1) {
        local_378 = 0.0;
        local_398 = 0.0;
      }
      else {
        local_398 = 0.0;
        uVar14 = 0;
        local_378 = 0.0;
        do {
          iVar15 = pHVar17[uVar14];
          HVectorBase<double>::clear(&local_2a0);
          local_2a0.packFlag = true;
          if (iVar15 < (int)uVar12) {
            piVar7 = (pHVar6->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            lVar11 = (long)piVar7[iVar15];
            if (piVar7[iVar15] < piVar7[(long)iVar15 + 1]) {
              piVar9 = (pHVar6->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              pdVar8 = (pHVar6->a_matrix_).value_.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              do {
                iVar3 = piVar9[lVar11];
                local_2a0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[iVar3] = pdVar8[lVar11];
                lVar16 = (long)local_2a0.count;
                local_2a0.count = local_2a0.count + 1;
                local_2a0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar16] = iVar3;
                lVar11 = lVar11 + 1;
              } while (lVar11 < piVar7[(long)iVar15 + 1]);
            }
          }
          else {
            local_2a0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[(int)(iVar15 - uVar12)] = 1.0;
            lVar11 = (long)local_2a0.count;
            local_2a0.count = local_2a0.count + 1;
            local_2a0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] = iVar15 - uVar12;
          }
          HVectorBase<double>::HVectorBase(&local_e0,&local_2a0);
          ftran(this,&local_2a0,0.0,(HighsTimerClock *)0x0);
          dVar22 = 0.0;
          uVar20 = 0;
          do {
            dVar21 = 1.0;
            if (uVar14 != uVar20) {
              dVar21 = 0.0;
            }
            if (dVar22 <= ABS(local_2a0.array.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar20] - dVar21)) {
              dVar22 = ABS(local_2a0.array.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar20] - dVar21);
            }
            uVar20 = uVar20 + 1;
          } while (uVar18 != uVar20);
          local_2a8 = debugInvertResidualError(this,false,&local_2a0,&local_e0);
          if (local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_start);
          }
          if (local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.array.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_398 <= dVar22) {
            local_398 = dVar22;
          }
          if (local_378 <= local_2a8) {
            local_378 = local_2a8;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar18);
      }
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"inverse","");
      debugReportInvertSolutionError
                (this,&local_120,false,local_398,local_378,iVar2 < alt_debug_level);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p);
      }
      if ((int)size_ < 1) {
        local_388 = 0.0;
        local_398 = 0.0;
      }
      else {
        uVar14 = 0;
        local_398 = 0.0;
        local_388 = 0.0;
        do {
          HVectorBase<double>::clear(&local_2a0);
          local_2a0.packFlag = true;
          uVar20 = 0;
          do {
            iVar15 = pHVar17[uVar20];
            if (iVar15 < (int)uVar12) {
              piVar7 = (pHVar6->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              iVar3 = piVar7[iVar15];
              lVar11 = (long)iVar3;
              iVar15 = piVar7[(long)iVar15 + 1];
              if (iVar3 < iVar15) {
                iVar15 = iVar15 - iVar3;
                do {
                  if (uVar14 == (uint)(pHVar6->a_matrix_).index_.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start[lVar11]) {
                    dVar22 = (pHVar6->a_matrix_).value_.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar11];
                    goto LAB_003651e0;
                  }
                  lVar11 = lVar11 + 1;
                  iVar15 = iVar15 + -1;
                } while (iVar15 != 0);
              }
            }
            else {
              dVar22 = 1.0;
              if (iVar15 == uVar12 + (int)uVar14) {
LAB_003651e0:
                local_2a0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar20] = dVar22;
              }
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 != uVar18);
          uVar20 = 0;
          do {
            if ((local_2a0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar20] != 0.0) ||
               (NAN(local_2a0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar20]))) {
              lVar11 = (long)local_2a0.count;
              local_2a0.count = local_2a0.count + 1;
              local_2a0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11] = (int)uVar20;
            }
            uVar20 = uVar20 + 1;
          } while (uVar18 != uVar20);
          HVectorBase<double>::HVectorBase(&local_e0,&local_2a0);
          btran(this,&local_2a0,0.0,(HighsTimerClock *)0x0);
          dVar22 = 0.0;
          uVar20 = 0;
          do {
            dVar21 = 1.0;
            if (uVar14 != uVar20) {
              dVar21 = 0.0;
            }
            if (dVar22 <= ABS(local_2a0.array.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar20] - dVar21)) {
              dVar22 = ABS(local_2a0.array.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar20] - dVar21);
            }
            uVar20 = uVar20 + 1;
          } while (uVar18 != uVar20);
          dVar21 = debugInvertResidualError(this,true,&local_2a0,&local_e0);
          if (local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.packValue.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_start);
          }
          if (local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_e0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.array.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_e0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_398 <= dVar22) {
            local_398 = dVar22;
          }
          if (local_388 <= dVar21) {
            local_388 = dVar21;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar18);
      }
      local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"inverse","");
      HVar10 = debugReportInvertSolutionError
                         (this,&local_140,true,local_398,local_388,iVar2 < alt_debug_level);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
      if (local_100 != local_f0) {
        operator_delete(local_100);
      }
    }
    if (local_1f0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.packValue.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_1f0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1f0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1f0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1f0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1f0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_368.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.packValue.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_368.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_368.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_368.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_368.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_368.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2a0.packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a0.packValue.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2a0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a0.packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2a0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a0.iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2a0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a0.cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2a0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a0.array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_2a0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2a0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return HVar10;
}

Assistant:

HighsDebugStatus HSimplexNla::debugCheckInvert(
    const std::string message, const HighsInt alt_debug_level) const {
  // Sometimes a value other than highs_debug_level is passed as
  // alt_debug_level, either to force debugging, or to limit
  // debugging. If no value is passed, then alt_debug_level = -1, and
  // highs_debug_level is used
  const HighsInt use_debug_level = alt_debug_level >= 0
                                       ? alt_debug_level
                                       : this->options_->highs_debug_level;
  if (use_debug_level < kHighsDebugLevelCostly)
    return HighsDebugStatus::kNotChecked;
  // If highs_debug_level isn't being used, then indicate that it's
  // being forced, and also force reporting of OK errors
  const bool force = alt_debug_level > this->options_->highs_debug_level;
  if (force)
    highsLogDev(this->options_->log_options, HighsLogType::kInfo,
                "CheckNlaINVERT:   Forcing debug\n");

  HighsDebugStatus return_status = HighsDebugStatus::kNotChecked;
  return_status = HighsDebugStatus::kOk;

  const HighsInt num_row = this->lp_->num_row_;
  const HighsInt num_col = this->lp_->num_col_;
  const vector<HighsInt>& a_matrix_start = this->lp_->a_matrix_.start_;
  const vector<HighsInt>& a_matrix_index = this->lp_->a_matrix_.index_;
  const vector<double>& a_matrix_value = this->lp_->a_matrix_.value_;
  const HighsInt* basic_index = this->basic_index_;
  const HighsOptions* options = this->options_;
  // Make sure that this isn't called between the matrix and LP resizing
  assert(num_row == this->lp_->a_matrix_.num_row_);
  assert(num_col == this->lp_->a_matrix_.num_col_);
  const bool report = (options->log_dev_level != 0);

  highsLogDev(options->log_options, HighsLogType::kInfo, "\nCheckINVERT: %s\n",
              message.c_str());

  HVector column;
  HVector rhs;
  column.setup(num_row);
  rhs.setup(num_row);
  HVector residual;
  double expected_density = 1;

  const bool random_ftran_test = true;
  const bool report_basis = options->log_dev_level > 1 && num_row < 20;
  if (random_ftran_test) {
    // Solve for a random solution
    HighsRandom random(1);
    // Solve Bx=b
    column.clear();
    rhs.clear();
    column.count = -1;
    if (report_basis)
      highsLogDev(options_->log_options, HighsLogType::kInfo, "Basis:");
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      rhs.index[rhs.count++] = iRow;
      double value = random.fraction();
      column.array[iRow] = value;
      HighsInt iCol = basic_index[iRow];
      if (report_basis)
        highsLogDev(options_->log_options, HighsLogType::kInfo, " %1d",
                    (int)iCol);
      if (iCol < num_col) {
        for (HighsInt iEl = a_matrix_start[iCol];
             iEl < a_matrix_start[iCol + 1]; iEl++) {
          HighsInt index = a_matrix_index[iEl];
          rhs.array[index] += value * a_matrix_value[iEl];
        }
      } else {
        HighsInt index = iCol - num_col;
        assert(index < num_row);
        rhs.array[index] += value;
      }
    }
    if (report_basis)
      highsLogDev(options_->log_options, HighsLogType::kInfo, "\n");
    residual = rhs;
    //  if (options->log_dev_level) {
    //    reportArray("Random solution before FTRAN", &column, true);
    //    reportArray("Random RHS      before FTRAN", &rhs, true);
    //  }
    this->ftran(rhs, expected_density);

    return_status =
        debugReportInvertSolutionError(false, column, rhs, residual, force);
  }

  const bool random_btran_test = true;
  if (random_btran_test) {
    // Solve B^Tx=b
    rhs.clear();
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      rhs.index[rhs.count++] = iRow;
      HighsInt iCol = basic_index[iRow];
      if (iCol < num_col) {
        for (HighsInt iEl = a_matrix_start[iCol];
             iEl < a_matrix_start[iCol + 1]; iEl++) {
          rhs.array[iRow] +=
              column.array[a_matrix_index[iEl]] * a_matrix_value[iEl];
        }
      } else {
        rhs.array[iRow] += column.array[iCol - num_col];
      }
    }
    residual = rhs;
    this->btran(rhs, expected_density);

    return_status =
        debugReportInvertSolutionError(true, column, rhs, residual, force);
  }

  if (use_debug_level < kHighsDebugLevelExpensive) return return_status;

  std::string value_adjective;
  expected_density = 0;
  double inverse_error_norm = 0;
  double residual_error_norm = 0;
  const bool test_inverse_ftran = true;
  if (test_inverse_ftran) {
    // Solve BX=B
    HighsInt check_col = -1;
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      HighsInt iCol = basic_index[iRow];
      column.clear();
      column.packFlag = true;
      if (iCol < num_col) {
        for (HighsInt k = a_matrix_start[iCol]; k < a_matrix_start[iCol + 1];
             k++) {
          HighsInt index = a_matrix_index[k];
          column.array[index] = a_matrix_value[k];
          column.index[column.count++] = index;
        }
      } else {
        HighsInt index = iCol - num_col;
        column.array[index] = 1.0;
        column.index[column.count++] = index;
      }
      const bool report_col = report && iRow == check_col;
      if (report_col) {
        reportArray("Check col before FTRAN", &column, true);
        //      factor_.reportLu(kReportLuBoth, true);
      }
      HVector residual = column;
      this->ftran(column, expected_density);
      if (report_col) reportArray("Check col after  FTRAN", &column, true);
      double inverse_col_error_norm = 0;
      for (HighsInt lc_iRow = 0; lc_iRow < num_row; lc_iRow++) {
        double ckValue = lc_iRow == iRow ? 1 : 0;
        double inverse_error = fabs(column.array[lc_iRow] - ckValue);
        inverse_col_error_norm =
            std::max(inverse_error, inverse_col_error_norm);
      }
      // Extra printing of intermediate errors
      if (report_col)
        highsLogDev(
            options->log_options, HighsLogType::kInfo,
            "CheckINVERT: Basic column %2d = %2d has inverse error %11.4g\n",
            (int)iRow, int(iCol), inverse_col_error_norm);
      inverse_error_norm = std::max(inverse_col_error_norm, inverse_error_norm);
      double residual_col_error_norm =
          debugInvertResidualError(false, column, residual);
      residual_error_norm =
          std::max(residual_col_error_norm, residual_error_norm);
    }
    return_status = debugReportInvertSolutionError(
        "inverse", false, inverse_error_norm, residual_error_norm, force);
  }

  const bool test_inverse_btran = true;
  if (test_inverse_btran) {
    // Solve B^TX=B^T
    HighsInt check_row = -2;
    inverse_error_norm = 0;
    residual_error_norm = 0;
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      column.clear();
      column.packFlag = true;
      for (HighsInt iCol = 0; iCol < num_row; iCol++) {
        HighsInt iVar = basic_index[iCol];
        if (iVar < num_col) {
          for (HighsInt k = a_matrix_start[iVar]; k < a_matrix_start[iVar + 1];
               k++) {
            if (a_matrix_index[k] == iRow) {
              column.array[iCol] = a_matrix_value[k];
              break;
            }
          }
        } else {
          if (iVar == num_col + iRow) column.array[iCol] = 1.0;
        }
      }
      for (HighsInt iCol = 0; iCol < num_row; iCol++) {
        if (column.array[iCol]) column.index[column.count++] = iCol;
      }
      const bool report_row = report && iRow == check_row;
      if (report_row) {
        reportArray("Check col before BTRAN", &column, true);
        //      factor_.reportLu(kReportLuBoth, true);
      }
      HVector residual = column;
      this->btran(column, expected_density);
      if (report_row) reportArray("Check col after  BTRAN", &column, true);
      double inverse_col_error_norm = 0;
      for (HighsInt lc_iRow = 0; lc_iRow < num_row; lc_iRow++) {
        double value = column.array[lc_iRow];
        double ckValue = lc_iRow == iRow ? 1 : 0;
        double inverse_error = fabs(value - ckValue);
        inverse_col_error_norm =
            std::max(inverse_error, inverse_col_error_norm);
      }
      // Extra printing of intermediate errors
      if (report_row)
        highsLogDev(
            options->log_options, HighsLogType::kInfo,
            "CheckINVERT: Basis matrix row %2d has inverse error %11.4g\n",
            (int)iRow, inverse_col_error_norm);
      inverse_error_norm = std::max(inverse_col_error_norm, inverse_error_norm);
      double residual_col_error_norm =
          debugInvertResidualError(true, column, residual);
      residual_error_norm =
          std::max(residual_col_error_norm, residual_error_norm);
    }
    return_status = debugReportInvertSolutionError(
        "inverse", true, inverse_error_norm, residual_error_norm, force);
  }

  return return_status;
}